

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  bool bVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," build ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &DAT_00164378,"master");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout," (");
    poVar2 = std::operator<<(poVar2,(string *)&DAT_00164378);
    std::operator<<(poVar2," branch)");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "For more detail usage please see the project docs\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            std::cout << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != "master" )
                std::cout << " (" << libraryVersion.branchName << " branch)";
            std::cout << "\n";

            m_cli.usage( std::cout, processName );
            std::cout << "For more detail usage please see the project docs\n" << std::endl;
        }